

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON * cJSON_ParseWithOpts(char *value,char **return_parse_end,cJSON_bool require_null_terminated)

{
  cJSON_bool cVar1;
  size_t sVar2;
  cJSON *item;
  parse_buffer *input_buffer;
  size_t sVar3;
  size_t sVar4;
  long in_FS_OFFSET;
  parse_buffer local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  item = (cJSON *)0x0;
  local_68.depth = 0;
  global_error_0 = (char *)0x0;
  global_error_1 = 0;
  if (value == (char *)0x0) goto LAB_00103543;
  local_68.content = (uchar *)value;
  sVar2 = strlen(value);
  sVar4 = sVar2 + 1;
  local_68.offset = 0;
  local_68.hooks.allocate._0_4_ = global_hooks.allocate._0_4_;
  local_68.hooks.allocate._4_4_ = global_hooks.allocate._4_4_;
  local_68.hooks.deallocate._0_4_ = global_hooks.deallocate._0_4_;
  local_68.hooks.deallocate._4_4_ = global_hooks.deallocate._4_4_;
  local_68.hooks.reallocate = global_hooks.reallocate;
  local_68.length = sVar4;
  item = (cJSON *)(*(code *)CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_))(0x40)
  ;
  if (item == (cJSON *)0x0) {
    sVar3 = 0;
  }
  else {
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    if ((((4 < sVar4) && (*value == -0x11)) && (value[1] == -0x45)) && (value[2] == -0x41)) {
      local_68.offset = 3;
    }
    input_buffer = buffer_skip_whitespace(&local_68);
    cVar1 = parse_value(item,input_buffer);
    if (cVar1 != 0) {
      if (require_null_terminated != 0) {
        if (local_68.content != (uchar *)0x0) {
          if (local_68.offset < local_68.length) {
            do {
              if (0x20 < local_68.content[local_68.offset]) goto LAB_001034e7;
              local_68.offset = local_68.offset + 1;
            } while (local_68.length != local_68.offset);
          }
          else {
LAB_001034e7:
            if (local_68.offset != local_68.length) goto LAB_001034f5;
          }
          local_68.offset = local_68.length - 1;
        }
LAB_001034f5:
        if ((local_68.length <= local_68.offset) || (local_68.content[local_68.offset] != '\0'))
        goto LAB_00103500;
      }
      if (return_parse_end != (char **)0x0) {
        *return_parse_end = (char *)(local_68.content + local_68.offset);
      }
      goto LAB_00103543;
    }
LAB_00103500:
    cJSON_Delete(item);
    sVar3 = local_68.offset;
    sVar4 = local_68.length;
  }
  global_error_1 = 0;
  if (sVar4 != 0) {
    global_error_1 = sVar4 - 1;
  }
  if (sVar3 < sVar4) {
    global_error_1 = sVar3;
  }
  if (return_parse_end != (char **)0x0) {
    *return_parse_end = value + global_error_1;
  }
  item = (cJSON *)0x0;
  global_error_0 = value;
LAB_00103543:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return item;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithOpts(const char *value, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = strlen((const char*)value) + sizeof("");
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(skip_utf8_bom(&buffer))))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }

        global_error = local_error;
    }

    return NULL;
}